

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

int key_type(Filename *filename)

{
  LoadFileStatus LVar1;
  int iVar2;
  LoadedFile *lf;
  
  lf = (LoadedFile *)safemalloc(1,0x40,0x400);
  lf->data = (char *)(lf + 1);
  lf->len = 0;
  lf->max_size = 0x400;
  LVar1 = lf_load(lf,filename);
  iVar2 = 0;
  if (LVar1 != LF_ERROR) {
    iVar2 = key_type_s(lf->binarysource_);
  }
  lf_free(lf);
  return iVar2;
}

Assistant:

int key_type(const Filename *filename)
{
    LoadedFile *lf = lf_new(1024);
    if (lf_load(lf, filename) == LF_ERROR) {
        lf_free(lf);
        return SSH_KEYTYPE_UNOPENABLE;
    }

    int toret = key_type_s(BinarySource_UPCAST(lf));
    lf_free(lf);
    return toret;
}